

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

int kj::TlsConnection::bioRead(BIO *b,char *out,int outl)

{
  int iVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *n;
  ArrayPtr<char> local_68;
  ArrayPtr<unsigned_char> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  NullableValue<unsigned_long> _n432;
  int outl_local;
  char *out_local;
  BIO *b_local;
  
  _n432.field_1.value._4_4_ = outl;
  BIO_clear_flags((BIO *)b,0xf);
  iVar1 = BIO_get_data(b);
  local_68 = arrayPtr<char>(out,(long)(int)_n432.field_1.value._4_4_);
  local_58 = ArrayPtr<char>::asBytes(&local_68);
  ReadyInputStreamWrapper::read
            ((ReadyInputStreamWrapper *)local_48,iVar1 + 0x40,local_58.ptr,local_58.size_);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_48);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_38,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_48);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_38);
  if (puVar2 == (unsigned_long *)0x0) {
    BIO_set_flags((BIO *)b,9);
    b_local._4_4_ = -1;
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_38);
    b_local._4_4_ = (int)*puVar2;
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_38);
  return b_local._4_4_;
}

Assistant:

static int bioRead(BIO* b, char* out, int outl) {
    BIO_clear_retry_flags(b);
    KJ_IF_SOME(n, reinterpret_cast<TlsConnection*>(BIO_get_data(b))->readBuffer
        .read(kj::arrayPtr(out, outl).asBytes())) {
      return n;
    } else {
      BIO_set_retry_read(b);
      return -1;
    }